

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::LSTMWeightParams::MergeFrom(LSTMWeightParams *this,LSTMWeightParams *from)

{
  void *pvVar1;
  LogMessage *other;
  WeightParams *pWVar2;
  WeightParams *pWVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xb02b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pWVar3 = from->inputgateweightmatrix_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->inputgateweightmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->inputgateweightmatrix_ = pWVar2;
      pWVar3 = from->inputgateweightmatrix_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->forgetgateweightmatrix_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->forgetgateweightmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->forgetgateweightmatrix_ = pWVar2;
      pWVar3 = from->forgetgateweightmatrix_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->blockinputweightmatrix_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->blockinputweightmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->blockinputweightmatrix_ = pWVar2;
      pWVar3 = from->blockinputweightmatrix_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->outputgateweightmatrix_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->outputgateweightmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->outputgateweightmatrix_ = pWVar2;
      pWVar3 = from->outputgateweightmatrix_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->inputgaterecursionmatrix_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->inputgaterecursionmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->inputgaterecursionmatrix_ = pWVar2;
      pWVar3 = from->inputgaterecursionmatrix_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->forgetgaterecursionmatrix_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->forgetgaterecursionmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->forgetgaterecursionmatrix_ = pWVar2;
      pWVar3 = from->forgetgaterecursionmatrix_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->blockinputrecursionmatrix_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->blockinputrecursionmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->blockinputrecursionmatrix_ = pWVar2;
      pWVar3 = from->blockinputrecursionmatrix_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->outputgaterecursionmatrix_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->outputgaterecursionmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->outputgaterecursionmatrix_ = pWVar2;
      pWVar3 = from->outputgaterecursionmatrix_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->inputgatebiasvector_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->inputgatebiasvector_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->inputgatebiasvector_ = pWVar2;
      pWVar3 = from->inputgatebiasvector_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->forgetgatebiasvector_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->forgetgatebiasvector_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->forgetgatebiasvector_ = pWVar2;
      pWVar3 = from->forgetgatebiasvector_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->blockinputbiasvector_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->blockinputbiasvector_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->blockinputbiasvector_ = pWVar2;
      pWVar3 = from->blockinputbiasvector_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->outputgatebiasvector_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->outputgatebiasvector_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->outputgatebiasvector_ = pWVar2;
      pWVar3 = from->outputgatebiasvector_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->inputgatepeepholevector_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->inputgatepeepholevector_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->inputgatepeepholevector_ = pWVar2;
      pWVar3 = from->inputgatepeepholevector_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->forgetgatepeepholevector_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->forgetgatepeepholevector_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->forgetgatepeepholevector_ = pWVar2;
      pWVar3 = from->forgetgatepeepholevector_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->outputgatepeepholevector_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)&_LSTMWeightParams_default_instance_) {
    pWVar2 = this->outputgatepeepholevector_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->outputgatepeepholevector_ = pWVar2;
      pWVar3 = from->outputgatepeepholevector_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  return;
}

Assistant:

void LSTMWeightParams::MergeFrom(const LSTMWeightParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LSTMWeightParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_inputgateweightmatrix()) {
    mutable_inputgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.inputgateweightmatrix());
  }
  if (from.has_forgetgateweightmatrix()) {
    mutable_forgetgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.forgetgateweightmatrix());
  }
  if (from.has_blockinputweightmatrix()) {
    mutable_blockinputweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.blockinputweightmatrix());
  }
  if (from.has_outputgateweightmatrix()) {
    mutable_outputgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.outputgateweightmatrix());
  }
  if (from.has_inputgaterecursionmatrix()) {
    mutable_inputgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.inputgaterecursionmatrix());
  }
  if (from.has_forgetgaterecursionmatrix()) {
    mutable_forgetgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.forgetgaterecursionmatrix());
  }
  if (from.has_blockinputrecursionmatrix()) {
    mutable_blockinputrecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.blockinputrecursionmatrix());
  }
  if (from.has_outputgaterecursionmatrix()) {
    mutable_outputgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.outputgaterecursionmatrix());
  }
  if (from.has_inputgatebiasvector()) {
    mutable_inputgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from.inputgatebiasvector());
  }
  if (from.has_forgetgatebiasvector()) {
    mutable_forgetgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from.forgetgatebiasvector());
  }
  if (from.has_blockinputbiasvector()) {
    mutable_blockinputbiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from.blockinputbiasvector());
  }
  if (from.has_outputgatebiasvector()) {
    mutable_outputgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from.outputgatebiasvector());
  }
  if (from.has_inputgatepeepholevector()) {
    mutable_inputgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from.inputgatepeepholevector());
  }
  if (from.has_forgetgatepeepholevector()) {
    mutable_forgetgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from.forgetgatepeepholevector());
  }
  if (from.has_outputgatepeepholevector()) {
    mutable_outputgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from.outputgatepeepholevector());
  }
}